

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O2

void __thiscall pstore::http::sha1::pad_message(sha1 *this)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)this->index_;
  (this->message_block_)._M_elems[uVar2] = 0x80;
  if (uVar2 < 0x38) {
    for (; (uint)uVar2 < 0x37; uVar2 = uVar2 + 1) {
      (this->message_block_)._M_elems[uVar2 + 1] = '\0';
    }
    this->index_ = (uint)uVar2 + 1;
  }
  else {
    while( true ) {
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      if (0x3f < uVar1) break;
      (this->message_block_)._M_elems[uVar2] = '\0';
    }
    this->index_ = uVar1;
    process_message_block(this);
    uVar2 = (ulong)this->index_;
    while (uVar2 < 0x38) {
      (this->message_block_)._M_elems[uVar2] = '\0';
      uVar2 = uVar2 + 1;
      this->index_ = (uint)uVar2;
    }
  }
  uVar2 = this->length_;
  *(ulong *)((this->message_block_)._M_elems + 0x38) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  process_message_block(this);
  return;
}

Assistant:

void sha1::pad_message () noexcept {
            // Note that many of the variable names in this code, especially the single character
            // names, were used because those were the names used in the publication.

            // Check to see if the current message block is too small to hold the initial padding
            // bits and length.  If so, we will pad the block, process it, and then continue padding
            // into a second block.
            if (index_ > 55) {
                message_block_[index_] = 0x80;
                ++index_;

                for (; index_ < 64; ++index_) {
                    message_block_[index_] = 0;
                }

                this->process_message_block ();

                for (; index_ < 56; ++index_) {
                    message_block_[index_] = 0;
                }
            } else {
                message_block_[index_] = 0x80;
                ++index_;
                for (; index_ < 56; ++index_) {
                    message_block_[index_] = 0;
                }
            }

            // Store the message length as the last 8 octets.
            message_block_[56] = static_cast<std::uint8_t> (length_ >> 56U);
            message_block_[57] = static_cast<std::uint8_t> (length_ >> 48U);
            message_block_[58] = static_cast<std::uint8_t> (length_ >> 40U);
            message_block_[59] = static_cast<std::uint8_t> (length_ >> 32U);
            message_block_[60] = static_cast<std::uint8_t> (length_ >> 24U);
            message_block_[61] = static_cast<std::uint8_t> (length_ >> 16U);
            message_block_[62] = static_cast<std::uint8_t> (length_ >> 8U);
            message_block_[63] = static_cast<std::uint8_t> (length_);

            this->process_message_block ();
        }